

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

int SMScaleAddNew_Band(realtype c,SUNMatrix A,SUNMatrix B)

{
  int iVar1;
  int iVar2;
  long lVar3;
  SUNMatrix p_Var4;
  long lVar5;
  long *in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  SUNMatrix C;
  realtype *C_colj;
  realtype *B_colj;
  realtype *A_colj;
  sunindextype smu;
  sunindextype mu;
  sunindextype ml;
  sunindextype j;
  sunindextype i;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  int local_20;
  int local_1c;
  
  if (*(int *)(*in_RSI + 0x10) < *(int *)(*in_RDI + 0x10)) {
    uVar7 = *(undefined4 *)(*in_RDI + 0x10);
  }
  else {
    uVar7 = *(undefined4 *)(*in_RSI + 0x10);
  }
  if (*(int *)(*in_RSI + 0xc) < *(int *)(*in_RDI + 0xc)) {
    uVar6 = *(undefined4 *)(*in_RDI + 0xc);
  }
  else {
    uVar6 = *(undefined4 *)(*in_RSI + 0xc);
  }
  p_Var4 = SUNBandMatrixStorage
                     ((sunindextype)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                      (sunindextype)in_stack_ffffffffffffffb8,
                      (sunindextype)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      (sunindextype)in_stack_ffffffffffffffb0,(SUNContext)CONCAT44(uVar7,uVar6));
  for (local_20 = 0; local_20 < *(int *)(*in_RDI + 4); local_20 = local_20 + 1) {
    lVar3 = *(long *)(*(long *)(*in_RDI + 0x28) + (long)local_20 * 8);
    iVar1 = *(int *)(*in_RDI + 0x14);
    lVar5 = *(long *)(*(long *)((long)p_Var4->content + 0x28) + (long)local_20 * 8);
    iVar2 = *(int *)((long)p_Var4->content + 0x14);
    for (local_1c = -*(int *)(*in_RDI + 0xc); local_1c <= *(int *)(*in_RDI + 0x10);
        local_1c = local_1c + 1) {
      *(double *)(lVar5 + (long)iVar2 * 8 + (long)local_1c * 8) =
           in_XMM0_Qa * *(double *)(lVar3 + (long)iVar1 * 8 + (long)local_1c * 8);
    }
  }
  for (local_20 = 0; local_20 < *(int *)(*in_RSI + 4); local_20 = local_20 + 1) {
    lVar3 = *(long *)(*(long *)(*in_RSI + 0x28) + (long)local_20 * 8);
    iVar1 = *(int *)(*in_RSI + 0x14);
    lVar5 = *(long *)(*(long *)((long)p_Var4->content + 0x28) + (long)local_20 * 8) +
            (long)*(int *)((long)p_Var4->content + 0x14) * 8;
    for (local_1c = -*(int *)(*in_RSI + 0xc); local_1c <= *(int *)(*in_RSI + 0x10);
        local_1c = local_1c + 1) {
      *(double *)(lVar5 + (long)local_1c * 8) =
           *(double *)(lVar3 + (long)iVar1 * 8 + (long)local_1c * 8) +
           *(double *)(lVar5 + (long)local_1c * 8);
    }
  }
  free(*(void **)(*in_RDI + 0x18));
  *(undefined8 *)(*in_RDI + 0x18) = 0;
  free(*(void **)(*in_RDI + 0x28));
  *(undefined8 *)(*in_RDI + 0x28) = 0;
  free((void *)*in_RDI);
  *in_RDI = 0;
  *in_RDI = (long)p_Var4->content;
  p_Var4->content = (void *)0x0;
  SUNMatDestroy_Band((SUNMatrix)0x1171ba8);
  return 0;
}

Assistant:

int SMScaleAddNew_Band(realtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j, ml, mu, smu;
  realtype *A_colj, *B_colj, *C_colj;
  SUNMatrix C;

  /* create new matrix large enough to hold both A and B */
  ml  = SUNMAX(SM_LBAND_B(A),SM_LBAND_B(B));
  mu  = SUNMAX(SM_UBAND_B(A),SM_UBAND_B(B));
  smu = SUNMIN(SM_COLUMNS_B(A)-1, mu + ml);
  C = SUNBandMatrixStorage(SM_COLUMNS_B(A), mu, ml, smu, A->sunctx);

  /* scale/add c*A into new matrix */
  for (j=0; j<SM_COLUMNS_B(A); j++) {
    A_colj = SM_COLUMN_B(A,j);
    C_colj = SM_COLUMN_B(C,j);
    for (i=-SM_UBAND_B(A); i<=SM_LBAND_B(A); i++)
      C_colj[i] = c*A_colj[i];
  }

  /* add B into new matrix */
  for (j=0; j<SM_COLUMNS_B(B); j++) {
    B_colj = SM_COLUMN_B(B,j);
    C_colj = SM_COLUMN_B(C,j);
    for (i=-SM_UBAND_B(B); i<=SM_LBAND_B(B); i++)
      C_colj[i] += B_colj[i];
  }

  /* replace A contents with C contents, nullify C content pointer, destroy C */
  free(SM_DATA_B(A));  SM_DATA_B(A) = NULL;
  free(SM_COLS_B(A));  SM_COLS_B(A) = NULL;
  free(A->content);    A->content = NULL;
  A->content = C->content;
  C->content = NULL;
  SUNMatDestroy_Band(C);

  return SUNMAT_SUCCESS;
}